

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.cpp
# Opt level: O1

void __thiscall vera::Pyramid::allocate(Pyramid *this,int _width,int _height)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Fbo *pFVar4;
  ulong uVar5;
  float fVar6;
  double dVar7;
  float fVar8;
  
  iVar1 = _width;
  if (_height < _width) {
    iVar1 = _height;
  }
  dVar7 = log2((double)iVar1);
  uVar2 = (uint)(long)(dVar7 + -1.0);
  uVar3 = 0xc;
  if (uVar2 < 0xc) {
    uVar3 = uVar2;
  }
  this->m_depth = uVar3;
  this->m_width = _width;
  this->m_height = _height;
  fVar6 = (float)_width;
  fVar8 = (float)_height;
  if (uVar3 != 0) {
    pFVar4 = this->m_downs;
    uVar5 = 0;
    do {
      fVar6 = fVar6 * 0.5;
      fVar8 = fVar8 * 0.5;
      (*pFVar4->_vptr_Fbo[2])(pFVar4,(long)fVar6,(long)fVar8,2,1,1,1);
      uVar5 = uVar5 + 1;
      pFVar4 = pFVar4 + 1;
    } while (uVar5 < this->m_depth);
  }
  if (this->m_depth != 0) {
    pFVar4 = this->m_ups;
    uVar5 = 0;
    do {
      fVar6 = fVar6 + fVar6;
      fVar8 = fVar8 + fVar8;
      (*pFVar4->_vptr_Fbo[2])(pFVar4,(long)fVar6,(long)fVar8,2,1,1,1);
      uVar5 = uVar5 + 1;
      pFVar4 = pFVar4 + 1;
    } while (uVar5 < this->m_depth);
  }
  return;
}

Assistant:

void Pyramid::allocate(int _width, int _height) {
    m_depth = log2(std::min(_width, _height)) - 1;
    m_depth = std::min((unsigned int)PYRAMID_MAX_LAYERS, m_depth);

    m_width = _width;
    m_height = _height;

    float w = _width;
    float h = _height;

    for (unsigned int i = 0; i < m_depth; i++) {
        w *= 0.5f;
        h *= 0.5f;
        m_downs[i].allocate(w, h, vera::COLOR_FLOAT_TEXTURE, vera::TextureFilter::NEAREST, vera::TextureWrap::CLAMP);
    }
    
    for (unsigned int i = 0; i < m_depth; i++) {
        w *= 2.0f;
        h *= 2.0f;
        m_ups[i].allocate(w, h, vera::COLOR_FLOAT_TEXTURE, vera::TextureFilter::NEAREST, vera::TextureWrap::CLAMP);
    }
}